

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_utility.cpp
# Opt level: O0

CSVReader * __thiscall
csv::parse(CSVReader *__return_storage_ptr__,csv *this,string_view in,CSVFormat *format)

{
  _Ios_Openmode _Var1;
  const_pointer __s;
  CSVFormat local_240;
  allocator<char> local_1d1;
  string local_1d0 [32];
  stringstream local_1b0 [8];
  stringstream stream;
  CSVFormat *format_local;
  string_view in_local;
  
  in_local._M_len = in._M_len;
  format_local = (CSVFormat *)this;
  in_local._M_str = (char *)__return_storage_ptr__;
  __s = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)&format_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,__s,&local_1d1);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b0,local_1d0,_Var1);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  CSVFormat::CSVFormat(&local_240,(CSVFormat *)in._M_str);
  CSVReader::
  CSVReader<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (__return_storage_ptr__,
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             &local_240);
  CSVFormat::~CSVFormat(&local_240);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE CSVReader parse(csv::string_view in, CSVFormat format) {
        std::stringstream stream(in.data());
        return CSVReader(stream, format);
    }